

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconvert_linux.c
# Opt level: O1

void CharConvSS(charconv *CC,char *Out,size_t OutLen,char *In)

{
  size_t sVar1;
  ulong __n;
  char *_Out;
  size_t _OutLen;
  size_t _InLen;
  char *_In;
  char *local_40;
  size_t local_38;
  size_t local_30;
  char *local_28;
  
  if (OutLen != 0) {
    local_28 = In;
    local_30 = strlen(In);
    local_30 = local_30 + 1;
    local_40 = Out;
    local_38 = OutLen;
    if (((local_30 == 0 || CC == (charconv *)0x0) ||
        (sVar1 = iconv(CC,&local_28,&local_30,&local_40,&local_38), sVar1 == 0xffffffffffffffff)) ||
       (sVar1 = iconv(CC,(char **)0x0,(size_t *)0x0,&local_40,&local_38),
       sVar1 == 0xffffffffffffffff)) {
      sVar1 = strlen(In);
      __n = OutLen - 1;
      if (sVar1 < OutLen - 1) {
        __n = sVar1;
      }
      memcpy(Out,In,__n);
      Out[__n] = '\0';
      if ((CC != (charconv *)0x0) && (local_30 != 0)) {
        iconv(CC,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
      }
    }
    else {
      *local_40 = '\0';
    }
  }
  return;
}

Assistant:

void CharConvSS(charconv* CC, char* Out, size_t OutLen, const char* In)
{
    if (OutLen>0)
    {
        ICONV_CONST char* _In = (ICONV_CONST char*)In;
        size_t _InLen = strlen(In)+1;
        char* _Out = Out;
        size_t _OutLen = OutLen;

        if (!CC || !_InLen || iconv((iconv_t)CC, &_In, &_InLen, &_Out, &_OutLen) == (size_t)-1 ||
             iconv((iconv_t)CC, NULL, NULL, &_Out, &_OutLen) == (size_t)-1)
        {
            size_t n = MIN(strlen(In),OutLen-1);
            memcpy(Out,In,n*sizeof(char));
            Out[n] = 0;
            if (CC && _InLen)
            {
//              DebugMessage("iconv failed: %d for '%s'",errno,In);
              iconv((iconv_t)CC, NULL, NULL, NULL, NULL); // reset state
            }
        }
        else
            *_Out=0;
    }
}